

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void ym2610_link_ssg(void *chip,ssg_callbacks *ssg,void *ssg_param)

{
  int pres;
  DEVFUNC_WRITE_CLOCK p_Var1;
  DEVFUNC_WRITE_A8D8 p_Var2;
  DEVFUNC_CTRL p_Var3;
  ulong uVar4;
  YM2610 *F2610;
  
  if (ssg == (ssg_callbacks *)0x0) {
    *(code **)((long)chip + 0x668) = ssgdummy_read;
    *(code **)((long)chip + 0x670) = ssgdummy_reset;
    *(undefined8 *)((long)chip + 0x658) = ssgdummy_set_clock;
    *(code **)((long)chip + 0x660) = ssgdummy_write;
    ssg_param = (void *)0x0;
  }
  else {
    p_Var1 = ssg->set_clock;
    p_Var2 = ssg->write;
    p_Var3 = ssg->reset;
    *(DEVFUNC_READ_A8D8 *)((long)chip + 0x668) = ssg->read;
    *(DEVFUNC_CTRL *)((long)chip + 0x670) = p_Var3;
    *(undefined8 *)((long)chip + 0x658) = p_Var1;
    *(DEVFUNC_WRITE_A8D8 *)((long)chip + 0x660) = p_Var2;
  }
  *(void **)((long)chip + 0x678) = ssg_param;
  uVar4 = (ulong)((*(byte *)((long)chip + 0x235) & 3) << 2);
  pres = *(int *)((long)OPNPrescaler_w::opn_pres + uVar4) * 2;
  OPNSetPres((FM_OPN *)((long)chip + 0x208),pres,pres,
             *(int *)((long)OPNPrescaler_w::ssg_pres + uVar4) * 2);
  return;
}

Assistant:

static void OPNLinkSSG(FM_OPN *OPN, const ssg_callbacks *ssg_cb, void *ssg_param)
{
	if (ssg_cb == NULL)
	{
		OPN->ST.SSG_funcs = ssg_dummy_funcs;
		OPN->ST.SSG_param = NULL;
	}
	else
	{
		OPN->ST.SSG_funcs = *ssg_cb;
		OPN->ST.SSG_param = ssg_param;
	}
	return;
}